

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.h
# Opt level: O2

uint Memory::HeapInfo::GetMediumBucketIndex(size_t sizeCat)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *in_FS_OFFSET;
  
  BVar3 = IsAlignedMediumObjectSize(sizeCat);
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.h"
                       ,0xca,"(IsAlignedMediumObjectSize(sizeCat))",
                       "IsAlignedMediumObjectSize(sizeCat)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *in_FS_OFFSET = 0;
  }
  return (uint)(sizeCat + 0xfffffffcff >> 8);
}

Assistant:

static uint GetMediumBucketIndex(size_t sizeCat) { Assert(IsAlignedMediumObjectSize(sizeCat)); return (uint)((sizeCat - HeapConstants::MaxSmallObjectSize - 1) / HeapConstants::MediumObjectGranularity); }